

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.cpp
# Opt level: O1

void __thiscall Memory::MarkContext::Release(MarkContext *this)

{
  PageStack<Memory::MarkContext::MarkCandidate>::Release(&this->markStack);
  PageStack<FinalizableObject_*>::Release(&this->trackStack);
  PagePool::ReleaseFreePages(this->pagePool);
  return;
}

Assistant:

void MarkContext::Release()
{
    markStack.Release();
#ifdef RECYCLER_VISITED_HOST
    preciseStack.Release();
#endif
    trackStack.Release();

    pagePool->ReleaseFreePages();
}